

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CExpStatement *statement)

{
  CExpression *pCVar1;
  CExpStatement *this_00;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  CExpStatement *local_18;
  CExpStatement *statement_local;
  CCallSimplifierVisitor *this_local;
  
  local_18 = statement;
  statement_local = (CExpStatement *)this;
  pCVar1 = CExpStatement::Expression(statement);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  this_00 = (CExpStatement *)operator_new(0x10);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_28,&this->childExpression);
  CExpStatement::CExpStatement(this_00,&local_28);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&this->childStatement,&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CExpStatement &statement) {
    statement.Expression()->Accept(*this);

    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CExpStatement(std::move(childExpression))
            )
    );
}